

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

crn_block_compressor_context_t crn_create_block_compressor(crn_comp_params *params)

{
  uint uVar1;
  crn_block_compressor *pComp;
  crn_comp_params *params_local;
  
  params_local = (crn_comp_params *)crnlib::crnlib_new<crnlib::crn_block_compressor>();
  uVar1 = crnlib::crn_block_compressor::init
                    ((crn_block_compressor *)params_local,(EVP_PKEY_CTX *)params);
  if ((uVar1 & 1) == 0) {
    crnlib::crnlib_delete<crnlib::crn_block_compressor>((crn_block_compressor *)params_local);
    params_local = (crn_comp_params *)0x0;
  }
  return params_local;
}

Assistant:

crn_block_compressor_context_t crn_create_block_compressor(const crn_comp_params& params) {
  crn_block_compressor* pComp = crnlib_new<crn_block_compressor>();
  if (!pComp->init(params)) {
    crnlib_delete(pComp);
    return NULL;
  }
  return pComp;
}